

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.hpp
# Opt level: O2

void __thiscall
fidler::ast::
OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
::OperatorExpression
          (OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
           *this,OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
                 *param_1)

{
  pointer ppVar1;
  
  OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>::
  OperatorExpression(&this->left,&param_1->left);
  ppVar1 = (param_1->right).
           super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->right).
       super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  (this->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->right).
       super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

OperatorExpression(OperatorExpression&&) = default;